

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O2

Gia_Obj_t * Gia_ManFraigMarkCis(Gia_Man_t *p,Gia_Obj_t *pObj,int fMark)

{
  Gia_Obj_t *pGVar1;
  undefined8 uVar2;
  
  uVar2 = *(undefined8 *)pObj;
  if (((uint)uVar2 & 0x9fffffff) != 0x9fffffff) {
    __assert_fail("Gia_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweep.c"
                  ,0xe5,"Gia_Obj_t *Gia_ManFraigMarkCis(Gia_Man_t *, Gia_Obj_t *, int)");
  }
  while (((uint)uVar2 & 0x9fffffff) == 0x9fffffff) {
    if (fMark != 0) {
      Gia_ObjSetTravIdCurrent(p,pObj);
    }
    pGVar1 = pObj + -1;
    pObj = pObj + -1;
    uVar2 = *(undefined8 *)pGVar1;
  }
  return pObj;
}

Assistant:

Gia_Obj_t * Gia_ManFraigMarkCis( Gia_Man_t * p, Gia_Obj_t * pObj, int fMark )
{
    for ( assert( Gia_ObjIsCi(pObj) ); Gia_ObjIsCi(pObj); pObj-- )
        if ( fMark )
            Gia_ObjSetTravIdCurrent( p, pObj );
    return pObj;
}